

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_pool_impl.cpp
# Opt level: O0

file_view_entry * __thiscall
libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::open_file_impl
          (file_view_entry *__return_storage_ptr__,
          file_pool_impl<libtorrent::aux::file_view_entry> *this,string *p,file_index_t file_index,
          file_storage *fs,open_mode_t m,file_id file_key)

{
  string_view name;
  int64_t size;
  storage_error *se;
  undefined1 local_50 [8];
  string file_path;
  file_storage *fs_local;
  string *p_local;
  file_pool_impl<libtorrent::aux::file_view_entry> *this_local;
  open_mode_t m_local;
  file_index_t file_index_local;
  
  file_path.field_2._8_8_ = fs;
  file_storage::file_path((string *)local_50,fs,file_index,p);
  name = (string_view)::std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_50)
  ;
  size = file_storage::file_size((file_storage *)file_path.field_2._8_8_,file_index);
  file_view_entry::file_view_entry(__return_storage_ptr__,file_key,name,m,size);
  ::std::__cxx11::string::~string((string *)local_50);
  return __return_storage_ptr__;
}

Assistant:

FileEntry file_pool_impl<FileEntry>::open_file_impl(std::string const& p
		, file_index_t const file_index, file_storage const& fs
		, open_mode_t const m, file_id const file_key
#if TORRENT_HAVE_MAP_VIEW_OF_FILE
		, std::shared_ptr<std::mutex> open_unmap_lock
#endif
		)
	{
		std::string const file_path = fs.file_path(file_index, p);
#if TORRENT_HAVE_MAP_VIEW_OF_FILE
		std::unique_lock<std::mutex> lou(*open_unmap_lock);
#endif
		try
		{
			return FileEntry(file_key, file_path, m, fs.file_size(file_index)
#if TORRENT_HAVE_MAP_VIEW_OF_FILE
				, open_unmap_lock
#endif
				);
		}
		catch (storage_error& se)
		{
			// opening the file failed. If it was because the directory was
			// missing, create it and try again. Otherwise, propagate the
			// error
			if (!(m & open_mode::write)
				|| (se.ec != boost::system::errc::no_such_file_or_directory
#ifdef TORRENT_WINDOWS
					// this is a workaround for improper handling of files on windows shared drives.
					// if the directory on a shared drive does not exist,
					// windows returns ERROR_IO_DEVICE instead of ERROR_FILE_NOT_FOUND
					&& se.ec != error_code(ERROR_IO_DEVICE, system_category())
#endif
				   ))
			{
				throw;
			}

			// create directory and try again
			// this means the directory the file is in doesn't exist.
			// so create it
			se.ec.clear();
			create_directories(parent_path(fs.file_path(file_index, p)), se.ec);

			if (se.ec)
			{
				// if the directory creation failed, don't try to open the file again
				// but actually just fail
				throw_ex<storage_error>(se);
			}

			return FileEntry(file_key, file_path, m, fs.file_size(file_index)
#if TORRENT_HAVE_MAP_VIEW_OF_FILE
				, open_unmap_lock
#endif
				);
		}
	}